

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrobjs.c
# Opt level: O2

FT_Error pfr_face_init(FT_Stream stream,FT_Face pfrface,FT_Int face_index,FT_Int num_params,
                      FT_Parameter *params)

{
  byte *pbVar1;
  byte bVar2;
  short sVar3;
  short sVar4;
  FT_Size memory;
  ushort *puVar5;
  FT_String *pFVar6;
  short sVar7;
  FT_Stream pFVar8;
  FT_ListNode pFVar9;
  FT_Long *pFVar10;
  long lVar11;
  FT_Long FVar12;
  FT_UInt16 FVar13;
  ushort uVar14;
  FT_Error FVar15;
  int iVar16;
  FT_ULong FVar17;
  ulong uVar18;
  ulong uVar19;
  FT_Bitmap_Size *pFVar20;
  FT_Pointer pvVar21;
  uint uVar22;
  FT_String **astring;
  int *piVar23;
  ushort uVar24;
  FT_Face pFVar25;
  byte *pbVar26;
  FT_Face pFVar27;
  uint uVar29;
  long lVar28;
  short sVar30;
  int iVar31;
  ulong uVar32;
  uint uVar33;
  uint uVar34;
  FT_Face pFVar35;
  bool bVar37;
  FT_Error error;
  undefined8 local_b8;
  FT_CharMapRec charmap;
  FT_Face local_90;
  FT_Error local_7c;
  FT_Face local_78;
  uint local_6c;
  ulong local_68;
  FT_String **local_60;
  FT_String **local_58;
  ulong local_50;
  long local_48;
  long local_40;
  ulong local_38;
  ulong uVar36;
  
  FVar15 = FT_Stream_Seek(stream,0);
  if (FVar15 != 0) {
    return 2;
  }
  FVar15 = FT_Stream_ReadFields(stream,pfr_header_fields,pfrface + 1);
  if (FVar15 != 0) {
    return 2;
  }
  FVar12 = pfrface[1].num_faces;
  piVar23 = (int *)((long)&pfrface[1].num_glyphs + 4);
  *piVar23 = *piVar23 + pfrface[1].num_charmaps * 0x10000;
  if ((int)FVar12 != 0x50465230) {
    return 2;
  }
  if (4 < *(uint *)((long)&pfrface[1].num_faces + 4)) {
    return 2;
  }
  if (*(uint *)((long)&pfrface[1].face_index + 4) < 0x3a) {
    return 2;
  }
  if ((int)pfrface[1].face_index != 0xd0a) {
    return 2;
  }
  uVar19 = (ulong)*(uint *)((long)&pfrface[1].face_flags + 4);
  FVar15 = FT_Stream_Seek(stream,uVar19);
  charmap.face = (FT_Face)CONCAT44(charmap.face._4_4_,FVar15);
  if (FVar15 != 0) {
    return FVar15;
  }
  FVar13 = FT_Stream_ReadUShort(stream,(FT_Error *)&charmap);
  if ((int)charmap.face != 0) {
    return (int)charmap.face;
  }
  if (0x3332 < FVar13) {
    return 8;
  }
  if (stream->size - uVar19 <= (ulong)((uint)FVar13 + (uint)FVar13 * 4 + 2)) {
    return 8;
  }
  uVar29 = (uint)FVar13;
  if (stream->size <= (ulong)(uVar29 * 0x17 + 0x5f)) {
    return 8;
  }
  local_7c = 0;
  pfrface->num_faces = (ulong)uVar29;
  if (face_index < 0) {
    return 0;
  }
  uVar33 = face_index & 0xffff;
  if (uVar29 <= uVar33) {
    return 6;
  }
  iVar31 = pfrface[1].num_charmaps;
  error = FT_Stream_Seek(stream,(ulong)*(uint *)((long)&pfrface[1].face_flags + 4));
  if (error != 0) {
    return error;
  }
  FVar13 = FT_Stream_ReadUShort(stream,&error);
  if (error != 0) {
    return error;
  }
  if (FVar13 <= uVar33) {
    return 6;
  }
  error = FT_Stream_Skip(stream,(ulong)(uVar33 * 5));
  if (error != 0) {
    return error;
  }
  FVar13 = FT_Stream_ReadUShort(stream,&error);
  if (error != 0) {
    return error;
  }
  FVar17 = FT_Stream_ReadUOffset(stream,&error);
  if (error != 0) {
    return error;
  }
  uVar29 = (uint)FVar13;
  *(uint *)((long)&pfrface[1].bbox.xMin + 4) = uVar29;
  *(int *)&pfrface[1].bbox.yMin = (int)FVar17;
  error = FT_Stream_Seek(stream,FVar17 & 0xffffffff);
  if (error != 0) {
    return error;
  }
  error = FT_Stream_EnterFrame(stream,(ulong)uVar29);
  if (error != 0) {
    return error;
  }
  if (FVar13 < 0xd) {
LAB_001ee5ce:
    error = 8;
    pFVar25 = charmap.face;
  }
  else {
    pbVar26 = stream->cursor;
    pFVar35 = (FT_Face)(pbVar26 + uVar29);
    *(int *)((long)&pfrface[1].bbox.yMin + 4) =
         (int)((uint)pbVar26[2] << 8 | (uint)pbVar26[1] << 0x10 | (uint)*pbVar26 << 0x18) >> 8;
    *(int *)&pfrface[1].bbox.xMax =
         (int)((uint)pbVar26[5] << 8 | (uint)pbVar26[4] << 0x10 | (uint)pbVar26[3] << 0x18) >> 8;
    *(int *)((long)&pfrface[1].bbox.xMax + 4) =
         (int)((uint)pbVar26[8] << 8 | (uint)pbVar26[7] << 0x10 | (uint)pbVar26[6] << 0x18) >> 8;
    *(int *)&pfrface[1].bbox.yMax =
         (int)((uint)pbVar26[0xb] << 8 | (uint)pbVar26[10] << 0x10 | (uint)pbVar26[9] << 0x18) >> 8;
    charmap.face = (FT_Face)(pbVar26 + 0xd);
    bVar2 = pbVar26[0xc];
    uVar29 = 0;
    if ((bVar2 & 4) != 0) {
      uVar34 = (uint)((bVar2 & 8) == 0);
      uVar29 = uVar34 ^ 5;
      if ((bVar2 & 3) != 0) {
        uVar29 = 2 - uVar34;
      }
    }
    if (pFVar35 < (FT_Face)((long)&(charmap.face)->num_faces +
                           (ulong)((2 - ((bVar2 & 0x20) == 0) & (int)((uint)bVar2 << 0x1b) >> 0x1f)
                                  + uVar29))) goto LAB_001ee5ce;
    if ((bVar2 & 4) != 0) {
      uVar24 = (ushort)(byte)(charmap.face)->num_faces;
      uVar29 = (uint)uVar24;
      if ((bVar2 & 8) == 0) {
        pFVar25 = (FT_Face)(pbVar26 + 0xe);
      }
      else {
        pFVar25 = (FT_Face)(pbVar26 + 0xf);
        uVar29 = (int)(short)(uVar24 << 8) | (uint)pbVar26[0xe];
      }
      pfrface[1].units_per_EM = (short)uVar29;
      pfrface[1].ascender = (short)(uVar29 >> 0x10);
      charmap.face = pFVar25;
      if ((bVar2 & 3) == 0) {
        charmap.face = (FT_Face)((long)&pFVar25->num_faces + 3);
        iVar16 = (int)((uint)*(byte *)((long)&pFVar25->num_faces + 2) << 8 |
                      (uint)*(byte *)((long)&pFVar25->num_faces + 1) << 0x10 |
                      (uint)(byte)pFVar25->num_faces << 0x18) >> 8;
        pfrface[1].max_advance_width = (short)iVar16;
        pfrface[1].max_advance_height = (short)((uint)iVar16 >> 0x10);
      }
    }
    if ((bVar2 & 0x10) != 0) {
      uVar24 = (ushort)(byte)(charmap.face)->num_faces;
      uVar29 = (uint)uVar24;
      if ((bVar2 & 0x20) == 0) {
        charmap.face = (FT_Face)((long)&(charmap.face)->num_faces + 1);
      }
      else {
        pFVar10 = &(charmap.face)->num_faces;
        charmap.face = (FT_Face)((long)&(charmap.face)->num_faces + 2);
        uVar29 = (int)(short)(uVar24 << 8) | (uint)*(byte *)((long)pFVar10 + 1);
      }
      pfrface[1].descender = (short)uVar29;
      pfrface[1].height = (short)(uVar29 >> 0x10);
    }
    FVar15 = 0;
    if (((bVar2 & 0x40) == 0) ||
       (error = pfr_extra_items_skip((FT_Byte **)&charmap,(FT_Byte *)pFVar35), FVar15 = error,
       pFVar25 = charmap.face, error == 0)) {
      error = FVar15;
      pFVar25 = (FT_Face)((long)&(charmap.face)->num_faces + 5);
      if (pFVar35 < pFVar25) goto LAB_001ee5ce;
      uVar24 = (ushort)(charmap.face)->num_faces;
      uVar24 = uVar24 << 8 | uVar24 >> 8;
      pfrface[1].underline_position = (short)(uint)uVar24;
      pfrface[1].underline_thickness = (short)((uint)uVar24 >> 0x10);
      *(uint *)&pfrface[1].glyph =
           (uint)*(byte *)((long)&(charmap.face)->num_faces + 4) |
           (uint)*(byte *)((long)&(charmap.face)->num_faces + 3) << 8 |
           (uint)*(byte *)((long)&(charmap.face)->num_faces + 2) << 0x10;
      if (iVar31 != 0) {
        pFVar27 = (FT_Face)((long)&(charmap.face)->num_faces + 6);
        charmap.face = pFVar25;
        if (pFVar35 < pFVar27) goto LAB_001ee5ce;
        uVar29 = (uint)CONCAT12((byte)pFVar25->num_faces,uVar24);
        pfrface[1].underline_position = (short)uVar29;
        pfrface[1].underline_thickness = (short)(uVar29 >> 0x10);
        pFVar25 = pFVar27;
      }
    }
  }
  charmap.face = pFVar25;
  FT_Stream_ExitFrame(stream);
  local_7c = error;
  if (error != 0) {
    return error;
  }
  uVar29._0_2_ = pfrface[1].underline_position;
  uVar29._2_2_ = pfrface[1].underline_thickness;
  uVar34 = *(uint *)&pfrface[1].glyph;
  memory = (FT_Size)stream->memory;
  pfrface[1].size = memory;
  *(uint *)&pfrface[1].charmap = uVar34;
  pfrface[2].bbox.xMax = 0;
  pfrface[2].bbox.yMax = (FT_Pos)&pfrface[2].bbox.xMax;
  FVar15 = FT_Stream_Seek(stream,(ulong)uVar34);
  if (FVar15 != 0) {
    return FVar15;
  }
  error = FT_Stream_EnterFrame(stream,(ulong)uVar29);
  if (error != 0) {
    return error;
  }
  puVar5 = (ushort *)stream->cursor;
  *(ushort **)&pfrface[2].max_advance_width = puVar5;
  pFVar35 = charmap.face;
  if (0xe < uVar29) {
    *(uint *)((long)&pfrface[1].charmap + 4) = (uint)(ushort)(*puVar5 << 8 | *puVar5 >> 8);
    uVar24 = puVar5[1] << 8 | puVar5[1] >> 8;
    *(uint *)&pfrface[1].driver = (uint)uVar24;
    uVar22 = (uint)(ushort)(puVar5[2] << 8 | puVar5[2] >> 8);
    *(uint *)((long)&pfrface[1].driver + 4) = uVar22;
    pfrface[1].memory =
         (FT_Memory)
         ((long)(short)((ushort)(byte)puVar5[3] << 8) | (ulong)*(byte *)((long)puVar5 + 7));
    pfrface[1].stream =
         (FT_Stream)
         ((long)(short)((ushort)(byte)puVar5[4] << 8) | (ulong)*(byte *)((long)puVar5 + 9));
    pfrface[1].sizes_list.head =
         (FT_ListNode)
         ((long)(short)((ushort)(byte)puVar5[5] << 8) | (ulong)*(byte *)((long)puVar5 + 0xb));
    pfrface[1].sizes_list.tail =
         (FT_ListNode)
         ((long)(short)((ushort)(byte)puVar5[6] << 8) | (ulong)*(byte *)((long)puVar5 + 0xd));
    local_90 = (FT_Face)((long)puVar5 + 0xf);
    bVar2 = (byte)puVar5[7];
    local_68 = (ulong)bVar2;
    *(uint *)&pfrface[1].autohint.data = (uint)bVar2;
    pFVar35 = local_90;
    if ((uVar24 != 0) && (uVar22 != 0)) {
      local_6c = bVar2 & 4;
      if ((bVar2 & 4) == 0) {
        if (uVar29 < 0x11) goto LAB_001ee66d;
        local_90 = (FT_Face)((long)puVar5 + 0x11);
        *(uint *)((long)&pfrface[1].autohint.data + 4) =
             (int)(short)((ushort)*(byte *)((long)puVar5 + 0xf) << 8) | (uint)(byte)puVar5[8];
      }
      pFVar25 = (FT_Face)((long)puVar5 + (ulong)uVar29);
      FVar15 = 0;
      if ((char)bVar2 < '\0') {
        charmap.face = local_90;
        error = pfr_extra_items_parse
                          ((FT_Byte **)&charmap,(FT_Byte *)pFVar25,pfr_phy_font_extra_items,
                           &pfrface[1].size);
        if (error != 0) goto LAB_001ee675;
        local_90 = charmap.face;
        FVar15 = error;
      }
      error = FVar15;
      local_b8 = (FT_Face)((long)&local_90->num_faces + 3);
      pFVar35 = local_90;
      if (local_b8 <= pFVar25) {
        local_48 = (ulong)(byte)local_90->num_faces * 0x10000;
        local_40 = (ulong)*(byte *)((long)&local_90->num_faces + 1) * 0x100;
        local_50 = (ulong)*(byte *)((long)&local_90->num_faces + 2);
        uVar19 = local_40 + local_48 | local_50;
        charmap.face = local_b8;
        if (uVar19 != 0) {
          charmap.face = (FT_Face)((long)&local_b8->num_faces + uVar19);
          pFVar35 = local_b8;
          local_78 = charmap.face;
          if (pFVar25 < charmap.face) goto LAB_001ee66d;
          local_58 = &pfrface[2].family_name;
          local_60 = (FT_String **)&pfrface[2].num_glyphs;
          uVar32 = uVar19;
          while (((uVar32 != 0 &&
                  (pFVar35 = (FT_Face)((long)&local_b8->num_faces + 4), pFVar35 <= local_78)) &&
                 (uVar24 = (ushort)local_b8->num_faces, uVar24 = uVar24 << 8 | uVar24 >> 8,
                 3 < uVar24))) {
            local_38 = (ulong)uVar24;
            bVar37 = uVar32 < local_38;
            uVar32 = uVar32 - local_38;
            if (bVar37) break;
            uVar14 = *(ushort *)((long)&local_b8->num_faces + 2);
            uVar14 = uVar14 << 8 | uVar14 >> 8;
            astring = local_58;
            if (uVar14 == 3) {
LAB_001ee948:
              error = pfr_aux_name_load((FT_Byte *)pFVar35,uVar24 - 4,(FT_Memory)memory,astring);
              if (error != 0) {
                return error;
              }
            }
            else if (uVar14 == 2) {
              if (0x23 < uVar24) {
                *(uint *)&pfrface[1].autohint.finalizer =
                     (int)(short)((ushort)*(byte *)((long)&local_b8->face_index + 6) << 8) |
                     (uint)*(byte *)((long)&local_b8->face_index + 7);
                *(uint *)((long)&pfrface[1].autohint.finalizer + 4) =
                     (int)(short)((ushort)(byte)local_b8->face_flags << 8) |
                     (uint)*(byte *)((long)&local_b8->face_flags + 1);
                *(uint *)&pfrface[1].extensions =
                     (int)(short)((ushort)*(byte *)((long)&local_b8->face_flags + 2) << 8) |
                     (uint)*(byte *)((long)&local_b8->face_flags + 3);
              }
            }
            else {
              astring = local_60;
              if (uVar14 == 1) goto LAB_001ee948;
            }
            local_b8 = (FT_Face)((long)&local_b8->num_faces + local_38);
          }
          local_b8 = local_78;
        }
        pFVar27 = (FT_Face)((long)&local_b8->num_faces + 1);
        pFVar35 = charmap.face;
        if (pFVar27 <= pFVar25) {
          bVar2 = (byte)local_b8->num_faces;
          *(uint *)&pfrface[2].available_sizes = (uint)bVar2;
          pFVar35 = pFVar27;
          if ((FT_Face)((long)&pFVar27->num_faces + (ulong)((uint)bVar2 + (uint)bVar2)) <= pFVar25)
          {
            charmap.face = pFVar27;
            pvVar21 = ft_mem_qrealloc((FT_Memory)memory,4,0,(ulong)bVar2,(void *)0x0,&error);
            *(FT_Pointer *)&pfrface[2].num_charmaps = pvVar21;
            if (error != 0) goto LAB_001ee675;
            for (uVar32 = 0; (uint)bVar2 + (uint)bVar2 != uVar32; uVar32 = uVar32 + 2) {
              *(uint *)((long)pvVar21 + uVar32 * 2) =
                   (int)(short)((ushort)*(byte *)((long)&local_90->num_faces + uVar32 + uVar19 + 4)
                               << 8) |
                   (uint)*(byte *)((long)&local_90->num_faces + uVar32 + uVar19 + 5);
            }
            pFVar27 = (FT_Face)((long)&local_90->face_index + uVar32 + uVar19 + 4);
            pFVar35 = charmap.face;
            if (pFVar27 <= pFVar25) {
              *(uint *)&pfrface[2].charmaps =
                   (uint)*(byte *)((long)&local_90->num_faces + uVar32 + uVar19 + 4);
              *(uint *)((long)&pfrface[2].charmaps + 4) =
                   (uint)*(byte *)((long)&local_90->num_faces + uVar32 + uVar19 + 5);
              uVar24 = *(ushort *)((long)&local_90->num_faces + uVar32 + uVar19 + 6);
              *(uint *)&pfrface[2].face_index = (uint)(ushort)(uVar24 << 8 | uVar24 >> 8);
              uVar24 = *(ushort *)((long)&local_90->face_index + uVar32 + uVar19);
              *(uint *)&pfrface[1].internal = (uint)(ushort)(uVar24 << 8 | uVar24 >> 8);
              uVar24 = *(ushort *)((long)&local_90->face_index + uVar32 + uVar19 + 2);
              uVar24 = uVar24 << 8 | uVar24 >> 8;
              *(uint *)&pfrface[2].generic.data = (uint)uVar24;
              pfrface[2].generic.finalizer =
                   (FT_Generic_Finalizer)
                   ((long)local_90 +
                   uVar32 + (((ulong)uVar34 + local_40 + local_50 + local_48) - (long)stream->cursor
                            ) + 0xc);
              pFVar35 = pFVar27;
              if (uVar24 != 0) {
                uVar29 = (uint)local_68;
                uVar34 = (uint)(local_68 >> 3) & 1;
                uVar36 = (ulong)uVar34;
                local_b8 = (FT_Face)(CONCAT44(local_b8._4_4_,uVar29) & 0xffffffff00000010);
                uVar18 = local_68 & 0x20;
                if ((FT_Face)((long)&local_90->face_index +
                             uVar32 + ((local_6c >> 1 | uVar34) +
                                       ((uVar29 & 0x20) >> 5) + ((uVar29 & 0x10) >> 4) +
                                      (5 - (uint)((local_68 & 2) == 0))) * (uint)uVar24 + uVar19 + 4
                             ) <= pFVar25) {
                  charmap.face = pFVar27;
                  pvVar21 = ft_mem_qrealloc((FT_Memory)memory,0x10,0,(ulong)uVar24,(void *)0x0,
                                            &error);
                  pfrface[2].bbox.xMin = (FT_Pos)pvVar21;
                  if (error == 0) {
                    for (lVar28 = 0; (ulong)uVar24 * 0x10 != lVar28; lVar28 = lVar28 + 0x10) {
                      bVar2 = (byte)pFVar27->num_faces;
                      uVar29 = (uint)bVar2;
                      if ((local_68 & 2) == 0) {
                        pbVar26 = (byte *)((long)&pFVar27->num_faces + 1);
                      }
                      else {
                        pbVar26 = (byte *)((long)&pFVar27->num_faces + 2);
                        uVar29 = (uint)CONCAT11(bVar2,*(byte *)((long)&pFVar27->num_faces + 1));
                      }
                      *(uint *)((long)pvVar21 + lVar28) = uVar29;
                      if (local_6c == 0) {
                        uVar29 = *(uint *)((long)&pfrface[1].autohint.data + 4);
                      }
                      else {
                        bVar2 = *pbVar26;
                        pbVar1 = pbVar26 + 1;
                        pbVar26 = pbVar26 + 2;
                        uVar29 = (int)(short)((ushort)bVar2 << 8) | (uint)*pbVar1;
                      }
                      *(uint *)((long)pvVar21 + lVar28 + 4) = uVar29;
                      uVar29 = (uint)pbVar26[uVar36];
                      if ((int)local_b8 == 0) {
                        lVar11 = uVar36 + 1;
                      }
                      else {
                        lVar11 = uVar36 + 2;
                        uVar29 = (uint)CONCAT11(pbVar26[uVar36],pbVar26[uVar36 + 1]);
                      }
                      pbVar26 = pbVar26 + lVar11;
                      *(uint *)((long)pvVar21 + lVar28 + 8) = uVar29;
                      uVar29 = (uint)pbVar26[1];
                      if (uVar18 == 0) {
                        pFVar27 = (FT_Face)(pbVar26 + 2);
                        uVar34 = (uint)*pbVar26 << 8;
                      }
                      else {
                        uVar29 = (uint)pbVar26[1] << 8 | (uint)*pbVar26 << 0x10;
                        uVar34 = (uint)pbVar26[2];
                        pFVar27 = (FT_Face)(pbVar26 + 3);
                      }
                      *(uint *)((long)pvVar21 + lVar28 + 0xc) = uVar34 | uVar29;
                    }
                  }
                  goto LAB_001ee675;
                }
              }
            }
          }
        }
      }
    }
  }
LAB_001ee66d:
  charmap.face = pFVar35;
  error = 8;
LAB_001ee675:
  FT_Stream_ExitFrame(stream);
  FVar17 = FT_Stream_Pos(stream);
  pfrface[2].units_per_EM = (short)FVar17;
  pfrface[2].ascender = (short)(FVar17 >> 0x10);
  pfrface[2].descender = (short)(FVar17 >> 0x20);
  pfrface[2].height = (short)(FVar17 >> 0x30);
  pfrface[2].max_advance_width = 0;
  pfrface[2].max_advance_height = 0;
  pfrface[2].underline_position = 0;
  pfrface[2].underline_thickness = 0;
  local_7c = error;
  if (error == 0) {
    pfrface->face_index = (ulong)uVar33;
    uVar32 = (ulong)*(uint *)&pfrface[2].generic.data;
    pfrface->num_glyphs = uVar32 + 1;
    uVar19 = pfrface->face_flags;
    uVar18 = uVar19 | 1;
    pfrface->face_flags = uVar18;
    lVar28 = 0xc;
    while (uVar32 != 0) {
      if (*(int *)(pfrface[2].bbox.xMin + lVar28) != 0) {
        if ((int)uVar32 != 0) goto LAB_001ee9ca;
        break;
      }
      lVar28 = lVar28 + 0x10;
      uVar32 = uVar32 - 1;
    }
    if (*(int *)&pfrface[2].style_name == 0) {
      error = 3;
    }
    else {
      uVar18 = uVar19 & 0xfffffffffffffffe;
LAB_001ee9ca:
      uVar29 = *(uint *)&pfrface[1].autohint.data;
      uVar33 = *(uint *)&pfrface[2].style_name;
      uVar32 = (ulong)uVar33;
      uVar19 = (ulong)((uVar29 & 1) << 4) + 0x10 | ~uVar29 & 4 | uVar18;
      pfrface->face_flags = uVar19;
      if (uVar32 != 0) {
        uVar19 = uVar19 | 2;
        pfrface->face_flags = uVar19;
      }
      if ((int)pfrface[2].bbox.yMin != 0) {
        pfrface->face_flags = uVar19 | 0x40;
      }
      pFVar6 = (FT_String *)pfrface[2].num_glyphs;
      pfrface->family_name = pFVar6;
      if (pFVar6 == (FT_String *)0x0) {
        pfrface->family_name = (FT_String *)pfrface[2].style_flags;
      }
      pfrface->num_fixed_sizes = 0;
      pfrface->available_sizes = (FT_Bitmap_Size *)0x0;
      uVar34 = *(uint *)&pfrface[1].driver;
      sVar3 = *(short *)&pfrface[1].sizes_list.tail;
      sVar4 = *(short *)&pfrface[1].stream;
      sVar7 = (short)((ulong)((uVar34 & 0xffff) * 0xc) / 10);
      iVar31 = (int)sVar3 - (int)sVar4;
      sVar30 = (short)iVar31;
      if (iVar31 <= sVar7) {
        sVar30 = sVar7;
      }
      pfrface->style_name = pfrface[2].family_name;
      pFVar8 = pfrface[1].stream;
      (pfrface->bbox).xMin = (FT_Pos)pfrface[1].memory;
      (pfrface->bbox).yMin = (FT_Pos)pFVar8;
      pFVar9 = pfrface[1].sizes_list.tail;
      (pfrface->bbox).xMax = (FT_Pos)pfrface[1].sizes_list.head;
      (pfrface->bbox).yMax = (FT_Pos)pFVar9;
      pfrface->units_per_EM = (FT_UShort)uVar34;
      pfrface->ascender = sVar3;
      pfrface->descender = sVar4;
      pfrface->height = sVar30;
      if (uVar33 != 0) {
        pFVar20 = (FT_Bitmap_Size *)
                  ft_mem_qrealloc(pfrface->stream->memory,0x20,0,uVar32,(void *)0x0,&local_7c);
        pfrface->available_sizes = pFVar20;
        if (local_7c != 0) {
          return local_7c;
        }
        piVar23 = (int *)(*(long *)&pfrface[2].num_fixed_sizes + 4);
        while (iVar31 = (int)uVar32, uVar32 = (ulong)(iVar31 - 1), iVar31 != 0) {
          iVar31 = *piVar23;
          pFVar20->height = (FT_Short)iVar31;
          iVar16 = piVar23[-1];
          pFVar20->width = (FT_Short)iVar16;
          uVar19 = (ulong)(uint)(iVar31 << 6);
          pFVar20->size = uVar19;
          pFVar20->x_ppem = (ulong)(uint)(iVar16 << 6);
          pFVar20->y_ppem = uVar19;
          pFVar20 = pFVar20 + 1;
          piVar23 = piVar23 + 10;
        }
        pfrface->num_fixed_sizes = uVar33;
        uVar29 = *(uint *)&pfrface[1].autohint.data;
      }
      if ((uVar29 & 4) == 0) {
        iVar31 = *(int *)((long)&pfrface[1].autohint.data + 4);
      }
      else {
        iVar16 = *(int *)&pfrface[2].generic.data;
        piVar23 = (int *)(pfrface[2].bbox.xMin + 4);
        iVar31 = 0;
        while (bVar37 = iVar16 != 0, iVar16 = iVar16 + -1, bVar37) {
          if (iVar31 <= *piVar23) {
            iVar31 = *piVar23;
          }
          piVar23 = piVar23 + 4;
        }
      }
      pfrface->max_advance_width = (FT_Short)iVar31;
      pfrface->max_advance_height = pfrface->height;
      pfrface->underline_position = -(pfrface->units_per_EM / 10);
      pfrface->underline_thickness = pfrface->units_per_EM / 0x1e;
      charmap.encoding = FT_ENCODING_UNICODE;
      charmap.platform_id = 3;
      charmap.encoding_id = 1;
      charmap.face = pfrface;
      error = FT_CMap_New(&pfr_cmap_class_rec,(FT_Pointer)0x0,&charmap,(FT_CMap_conflict *)0x0);
      if ((int)pfrface[2].bbox.yMin != 0) {
        *(byte *)&pfrface->face_flags = (byte)pfrface->face_flags | 0x40;
      }
    }
  }
  return error;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  pfr_face_init( FT_Stream      stream,
                 FT_Face        pfrface,
                 FT_Int         face_index,
                 FT_Int         num_params,
                 FT_Parameter*  params )
  {
    PFR_Face  face = (PFR_Face)pfrface;
    FT_Error  error;

    FT_UNUSED( num_params );
    FT_UNUSED( params );


    FT_TRACE2(( "PFR driver\n" ));

    /* load the header and check it */
    error = pfr_header_load( &face->header, stream );
    if ( error )
    {
      FT_TRACE2(( "  not a PFR font\n" ));
      error = FT_THROW( Unknown_File_Format );
      goto Exit;
    }

    if ( !pfr_header_check( &face->header ) )
    {
      FT_TRACE2(( "  not a PFR font\n" ));
      error = FT_THROW( Unknown_File_Format );
      goto Exit;
    }

    /* check face index */
    {
      FT_Long  num_faces;


      error = pfr_log_font_count( stream,
                                  face->header.log_dir_offset,
                                  &num_faces );
      if ( error )
        goto Exit;

      pfrface->num_faces = num_faces;
    }

    if ( face_index < 0 )
      goto Exit;

    if ( ( face_index & 0xFFFF ) >= pfrface->num_faces )
    {
      FT_ERROR(( "pfr_face_init: invalid face index\n" ));
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* load the face */
    error = pfr_log_font_load(
              &face->log_font,
              stream,
              (FT_UInt)( face_index & 0xFFFF ),
              face->header.log_dir_offset,
              FT_BOOL( face->header.phy_font_max_size_high ) );
    if ( error )
      goto Exit;

    /* load the physical font descriptor */
    error = pfr_phy_font_load( &face->phy_font, stream,
                               face->log_font.phys_offset,
                               face->log_font.phys_size );
    if ( error )
      goto Exit;

    /* set up all root face fields */
    {
      PFR_PhyFont  phy_font = &face->phy_font;


      pfrface->face_index = face_index & 0xFFFF;
      pfrface->num_glyphs = (FT_Long)phy_font->num_chars + 1;

      pfrface->face_flags |= FT_FACE_FLAG_SCALABLE;

      /* if gps_offset == 0 for all characters, we  */
      /* assume that the font only contains bitmaps */
      {
        FT_UInt  nn;


        for ( nn = 0; nn < phy_font->num_chars; nn++ )
          if ( phy_font->chars[nn].gps_offset != 0 )
            break;

        if ( nn == phy_font->num_chars )
        {
          if ( phy_font->num_strikes > 0 )
            pfrface->face_flags &= ~FT_FACE_FLAG_SCALABLE;
          else
          {
            FT_ERROR(( "pfr_face_init: font doesn't contain glyphs\n" ));
            error = FT_THROW( Invalid_File_Format );
            goto Exit;
          }
        }
      }

      if ( !( phy_font->flags & PFR_PHY_PROPORTIONAL ) )
        pfrface->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

      if ( phy_font->flags & PFR_PHY_VERTICAL )
        pfrface->face_flags |= FT_FACE_FLAG_VERTICAL;
      else
        pfrface->face_flags |= FT_FACE_FLAG_HORIZONTAL;

      if ( phy_font->num_strikes > 0 )
        pfrface->face_flags |= FT_FACE_FLAG_FIXED_SIZES;

      if ( phy_font->num_kern_pairs > 0 )
        pfrface->face_flags |= FT_FACE_FLAG_KERNING;

      /* If no family name was found in the `undocumented' auxiliary
       * data, use the font ID instead.  This sucks but is better than
       * nothing.
       */
      pfrface->family_name = phy_font->family_name;
      if ( !pfrface->family_name )
        pfrface->family_name = phy_font->font_id;

      /* note that the style name can be NULL in certain PFR fonts,
       * probably meaning `Regular'
       */
      pfrface->style_name = phy_font->style_name;

      pfrface->num_fixed_sizes = 0;
      pfrface->available_sizes = NULL;

      pfrface->bbox         = phy_font->bbox;
      pfrface->units_per_EM = (FT_UShort)phy_font->outline_resolution;
      pfrface->ascender     = (FT_Short) phy_font->bbox.yMax;
      pfrface->descender    = (FT_Short) phy_font->bbox.yMin;

      pfrface->height = (FT_Short)( ( pfrface->units_per_EM * 12 ) / 10 );
      if ( pfrface->height < pfrface->ascender - pfrface->descender )
        pfrface->height = (FT_Short)( pfrface->ascender - pfrface->descender );

      if ( phy_font->num_strikes > 0 )
      {
        FT_UInt          n, count = phy_font->num_strikes;
        FT_Bitmap_Size*  size;
        PFR_Strike       strike;
        FT_Memory        memory = pfrface->stream->memory;


        if ( FT_QNEW_ARRAY( pfrface->available_sizes, count ) )
          goto Exit;

        size   = pfrface->available_sizes;
        strike = phy_font->strikes;
        for ( n = 0; n < count; n++, size++, strike++ )
        {
          size->height = (FT_Short)strike->y_ppm;
          size->width  = (FT_Short)strike->x_ppm;
          size->size   = (FT_Pos)( strike->y_ppm << 6 );
          size->x_ppem = (FT_Pos)( strike->x_ppm << 6 );
          size->y_ppem = (FT_Pos)( strike->y_ppm << 6 );
        }
        pfrface->num_fixed_sizes = (FT_Int)count;
      }

      /* now compute maximum advance width */
      if ( ( phy_font->flags & PFR_PHY_PROPORTIONAL ) == 0 )
        pfrface->max_advance_width = (FT_Short)phy_font->standard_advance;
      else
      {
        FT_Int    max = 0;
        FT_UInt   count = phy_font->num_chars;
        PFR_Char  gchar = phy_font->chars;


        for ( ; count > 0; count--, gchar++ )
        {
          if ( max < gchar->advance )
            max = gchar->advance;
        }

        pfrface->max_advance_width = (FT_Short)max;
      }

      pfrface->max_advance_height = pfrface->height;

      pfrface->underline_position  = (FT_Short)( -pfrface->units_per_EM / 10 );
      pfrface->underline_thickness = (FT_Short)(  pfrface->units_per_EM / 30 );

      /* create charmap */
      {
        FT_CharMapRec  charmap;


        charmap.face        = pfrface;
        charmap.platform_id = TT_PLATFORM_MICROSOFT;
        charmap.encoding_id = TT_MS_ID_UNICODE_CS;
        charmap.encoding    = FT_ENCODING_UNICODE;

        error = FT_CMap_New( &pfr_cmap_class_rec, NULL, &charmap, NULL );
      }

      /* check whether we have loaded any kerning pairs */
      if ( phy_font->num_kern_pairs )
        pfrface->face_flags |= FT_FACE_FLAG_KERNING;
    }

  Exit:
    return error;
  }